

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,int depender_index,cmLinkItem *dependee_name,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *emitted)

{
  cmTarget *this_00;
  cmTarget *pcVar1;
  bool bVar2;
  pointer config;
  allocator local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string local_50;
  
  this_00 = dependee_name->Target;
  if (this_00 != (cmTarget *)0x0) {
    pcVar1 = (this->Targets).super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>
             ._M_impl.super__Vector_impl_data._M_start[depender_index];
    if ((this_00->TargetTypeValue == EXECUTABLE) &&
       (bVar2 = cmTarget::IsExecutableWithExports(this_00), !bVar2)) {
      return;
    }
    std::__cxx11::string::string((string *)&configs,"",&local_79);
    AddInterfaceDepends(this,depender_index,this_00,(string *)&configs,emitted);
    std::__cxx11::string::~string((string *)&configs);
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_50,pcVar1->Makefile,&configs,true);
    std::__cxx11::string::~string((string *)&local_50);
    for (config = configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        config != configs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; config = config + 1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)emitted,&pcVar1->Name);
      AddInterfaceDepends(this,depender_index,this_00,config,emitted);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configs);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(int depender_index,
                                             cmLinkItem const& dependee_name,
                                             std::set<std::string> &emitted)
{
  cmTarget const* depender = this->Targets[depender_index];
  cmTarget const* dependee = dependee_name.Target;
  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if(dependee &&
     dependee->GetType() == cmTarget::EXECUTABLE &&
     !dependee->IsExecutableWithExports())
    {
    dependee = 0;
    }

  if(dependee)
    {
    this->AddInterfaceDepends(depender_index, dependee, "", emitted);
    std::vector<std::string> configs;
    depender->GetMakefile()->GetConfigurations(configs);
    for (std::vector<std::string>::const_iterator it = configs.begin();
      it != configs.end(); ++it)
      {
      // A target should not depend on itself.
      emitted.insert(depender->GetName());
      this->AddInterfaceDepends(depender_index, dependee,
                                *it, emitted);
      }
    }
}